

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall
lts2::LBDOperator::fillBasisFunctionForIndex(LBDOperator *this,Mat *basisFunction,int idx)

{
  IntegratingCell *pIVar1;
  uint uVar2;
  undefined4 _x;
  undefined4 uVar3;
  undefined4 _y;
  undefined4 uVar4;
  undefined4 _x_00;
  undefined4 uVar5;
  undefined4 _y_00;
  undefined4 uVar6;
  _InputArray *p_Var7;
  float fVar8;
  Mat local_4b8 [352];
  Scalar_<double> local_358;
  _InputArray local_338;
  Rect_<int> local_320;
  Mat local_310 [96];
  Scalar_<double> local_2b0;
  Size_<int> local_290;
  undefined1 local_288 [8];
  Mat negImg;
  Scalar_<double> local_228;
  _InputArray local_208;
  Rect_<int> local_1f0;
  Mat local_1e0 [96];
  Scalar_<double> local_180;
  Size_<int> local_160;
  undefined1 local_158 [8];
  Mat posImg;
  undefined1 local_f0 [4];
  float value;
  Mat ROI;
  int iStack_88;
  int cellId;
  IntegratingCell cell;
  Scalar_<double> local_60;
  _InputArray local_40;
  Size_<int> local_24;
  int local_1c;
  _InputArray *p_Stack_18;
  int idx_local;
  Mat *basisFunction_local;
  LBDOperator *this_local;
  
  local_1c = idx;
  p_Stack_18 = (_InputArray *)basisFunction;
  basisFunction_local = (Mat *)this;
  cv::Size_<int>::Size_(&local_24,&this->_patchSize);
  cv::Mat::create(basisFunction,&local_24,5);
  p_Var7 = p_Stack_18;
  cv::Scalar_<double>::Scalar_(&local_60,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_40,(Matx<double,_4,_1> *)&local_60);
  cv::noArray();
  cv::Mat::setTo(p_Var7,&local_40);
  cv::_InputArray::~_InputArray(&local_40);
  cv::Mat::Mat((Mat *)local_f0);
  cv::Size_<int>::Size_(&local_160,&this->_patchSize);
  cv::Scalar_<double>::Scalar_(&local_180,0.0);
  cv::Mat::Mat((Mat *)local_158,&local_160,5,&local_180);
  uVar2 = this->_basisFunctions[local_1c].pos_cell;
  pIVar1 = this->_sensitiveCells + (int)uVar2;
  _x = pIVar1->xmin;
  uVar3 = pIVar1->xmax;
  _y = pIVar1->ymin;
  uVar4 = pIVar1->ymax;
  fVar8 = cv::saturate_cast<float>(this->_sensitiveCells[(int)uVar2].scaleFactor);
  cv::Rect_<int>::Rect_(&local_1f0,_x,_y,uVar3 - _x,uVar4 - _y);
  cv::Mat::operator()(local_1e0,(Rect *)local_158);
  cv::Mat::operator=((Mat *)local_f0,local_1e0);
  cv::Mat::~Mat(local_1e0);
  cv::Scalar_<double>::Scalar_(&local_228,(double)fVar8);
  cv::_InputArray::_InputArray<double,4,1>(&local_208,(Matx<double,_4,_1> *)&local_228);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_f0,&local_208);
  cv::_InputArray::~_InputArray(&local_208);
  cv::Size_<int>::Size_(&local_290,&this->_patchSize);
  cv::Scalar_<double>::Scalar_(&local_2b0,0.0);
  cv::Mat::Mat((Mat *)local_288,&local_290,5,&local_2b0);
  uVar2 = this->_basisFunctions[local_1c].neg_cell;
  pIVar1 = this->_sensitiveCells + (int)uVar2;
  _x_00 = pIVar1->xmin;
  uVar5 = pIVar1->xmax;
  _y_00 = pIVar1->ymin;
  uVar6 = pIVar1->ymax;
  fVar8 = cv::saturate_cast<float>(this->_sensitiveCells[(int)uVar2].scaleFactor);
  cv::Rect_<int>::Rect_(&local_320,_x_00,_y_00,uVar5 - _x_00,uVar6 - _y_00);
  cv::Mat::operator()(local_310,(Rect *)local_288);
  cv::Mat::operator=((Mat *)local_f0,local_310);
  cv::Mat::~Mat(local_310);
  cv::Scalar_<double>::Scalar_(&local_358,(double)fVar8);
  cv::_InputArray::_InputArray<double,4,1>(&local_338,(Matx<double,_4,_1> *)&local_358);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_f0,&local_338);
  cv::_InputArray::~_InputArray(&local_338);
  cv::operator-(local_4b8,(Mat *)local_158);
  cv::Mat::operator=((Mat *)p_Stack_18,(MatExpr *)local_4b8);
  cv::MatExpr::~MatExpr((MatExpr *)local_4b8);
  cv::Mat::~Mat((Mat *)local_288);
  cv::Mat::~Mat((Mat *)local_158);
  cv::Mat::~Mat((Mat *)local_f0);
  return;
}

Assistant:

void lts2::LBDOperator::fillBasisFunctionForIndex(cv::Mat &basisFunction, int idx) const
{
    // Output
    basisFunction.create(_patchSize, CV_32FC1);
    basisFunction.setTo(cv::Scalar(0));
    
    // Local structures needed
    lbd::IntegratingCell cell;
    int cellId;
    cv::Mat ROI;
    float value;

    //---------------//
    // Positive part //
    //---------------//
    
    cv::Mat posImg(_patchSize, CV_32F, cv::Scalar(0));
    cellId = _basisFunctions[idx].pos_cell;
    cell = _sensitiveCells[cellId];
    value = cv::saturate_cast<float>(cell.scaleFactor);
    
    // Extract ROI
    ROI = posImg(cv::Rect(cell.xmin, cell.ymin, 
                          cell.xmax-cell.xmin, cell.ymax-cell.ymin));
    
    // Set ROI to the correct value
    ROI.setTo(cv::Scalar(value));

    //---------------//
    // Negative part //
    //---------------//

    cv::Mat negImg(_patchSize, CV_32F, cv::Scalar(0));
    cellId = _basisFunctions[idx].neg_cell;
    cell = _sensitiveCells[cellId];
    value = cv::saturate_cast<float>(cell.scaleFactor);

    // Extract ROI
    ROI = negImg(cv::Rect(cell.xmin, cell.ymin, 
                          cell.xmax-cell.xmin, cell.ymax-cell.ymin));
    
    // Set ROI to the correct value
    ROI.setTo(cv::Scalar(value));
    
    //--------------//
    // Combine both //
    //--------------//
    basisFunction = posImg - negImg;
}